

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RangeDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_rangedynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  RangeDynamicLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_rangedynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_rangedynamic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::RangeDynamicLayerParams>(arena);
    (this->layer_).rangedynamic_ = pRVar2;
  }
  return (RangeDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RangeDynamicLayerParams* NeuralNetworkLayer::_internal_mutable_rangedynamic() {
  if (!_internal_has_rangedynamic()) {
    clear_layer();
    set_has_rangedynamic();
    layer_.rangedynamic_ = CreateMaybeMessage< ::CoreML::Specification::RangeDynamicLayerParams >(GetArenaForAllocation());
  }
  return layer_.rangedynamic_;
}